

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# doctest.h
# Opt level: O1

String * __thiscall
doctest::detail::stringifyBinaryExpr<std::__cxx11::string,char[3]>
          (String *__return_storage_ptr__,detail *this,
          basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *lhs,char *op,
          char (*rhs) [3])

{
  size_t sVar1;
  anon_union_24_2_13149d16_for_String_2 local_78;
  anon_union_24_2_13149d16_for_String_2 local_60;
  anon_union_24_2_13149d16_for_String_2 local_48;
  anon_union_24_2_13149d16_for_String_2 local_30;
  
  StringMakerBase<true>::convert<std::__cxx11::string>
            ((String *)&local_48.data,(StringMakerBase<true> *)this,lhs);
  sVar1 = strlen((char *)lhs);
  String::String((String *)&local_60.data,(char *)lhs,(uint)sVar1);
  String::operator+((String *)&local_30.data,(String *)&local_48.data,(String *)&local_60.data);
  StringMakerBase<true>::convert<char[3]>((String *)&local_78.data,(char (*) [3])op);
  String::operator+(__return_storage_ptr__,(String *)&local_30.data,(String *)&local_78.data);
  if ((local_78.buf[0x17] < '\0') && (local_78.data.ptr != (char *)0x0)) {
    operator_delete__(local_78.data.ptr);
  }
  if ((local_30.buf[0x17] < '\0') && (local_30.data.ptr != (char *)0x0)) {
    operator_delete__(local_30.data.ptr);
  }
  if ((local_60.buf[0x17] < '\0') && (local_60.data.ptr != (char *)0x0)) {
    operator_delete__(local_60.data.ptr);
  }
  if ((local_48.buf[0x17] < '\0') && (local_48.data.ptr != (char *)0x0)) {
    operator_delete__(local_48.data.ptr);
  }
  return __return_storage_ptr__;
}

Assistant:

String stringifyBinaryExpr(const DOCTEST_REF_WRAP(L) lhs, const char* op,
                               const DOCTEST_REF_WRAP(R) rhs) {
        // NOLINTNEXTLINE(clang-analyzer-cplusplus.NewDeleteLeaks)
        return toString(lhs) + op + toString(rhs);
    }